

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

bool __thiscall
r_comp::Compiler::expression
          (Compiler *this,Ptr *node,ReturnType t,uint16_t write_index,uint16_t *extent_index,
          bool write)

{
  ushort uVar1;
  element_type *peVar2;
  ImageObject *pIVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  Atom *pAVar7;
  long *plVar8;
  long *plVar9;
  size_type *psVar10;
  uint16_t write_index_00;
  string label;
  Class p;
  string local_178;
  undefined1 *local_158;
  long local_150;
  undefined1 local_148 [16];
  Ptr local_138;
  Ptr local_128;
  Ptr local_118;
  Ptr local_108;
  long *local_f8;
  long local_f0;
  long local_e8;
  long lStack_e0;
  Class local_d8;
  string local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70 [2];
  char local_60 [16];
  string local_50;
  
  peVar2 = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar2->type != Structure) {
    return false;
  }
  local_158 = local_148;
  local_150 = 0;
  local_148[0] = 0;
  iVar6 = std::__cxx11::string::compare((char *)&peVar2->label);
  if (iVar6 != 0) {
    std::__cxx11::string::substr
              ((ulong)&local_d8,
               (ulong)&((node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr)->label);
    std::__cxx11::string::operator=((string *)&local_158,(string *)&local_d8);
    if ((void *)local_d8._0_8_ != (void *)((long)&local_d8 + 0x10U)) {
      operator_delete((void *)local_d8._0_8_);
    }
  }
  Class::Class(&local_d8,ANY);
  local_108.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_108.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  if (local_108.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_108.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_108.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_108.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_108.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  bVar4 = expression_head(this,&local_108,&local_d8,t);
  if (local_108.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (bVar4) {
    if (iVar6 == 0) {
      if (write) {
LAB_00128944:
        r_code::Atom::IPointer((ushort)&local_178);
        pAVar7 = r_code::vector<r_code::Atom>::operator[]
                           ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)write_index);
        r_code::Atom::operator=(pAVar7,(Atom *)&local_178);
LAB_00128973:
        r_code::Atom::~Atom((Atom *)&local_178);
        pIVar3 = this->current_object;
        uVar1 = *extent_index;
        *extent_index = uVar1 + 1;
        pAVar7 = r_code::vector<r_code::Atom>::operator[]
                           ((vector<r_code::Atom> *)(pIVar3 + 8),(ulong)uVar1);
        r_code::Atom::operator=(pAVar7,&local_d8.atom);
        write_index_00 = (uint16_t)(byte)*extent_index;
        bVar5 = r_code::Atom::getAtomCount();
        *extent_index = *extent_index + (ushort)bVar5;
      }
      else {
LAB_001289c5:
        write_index_00 = 0;
      }
      local_138.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_138.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
      if (local_138.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_138.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi)->_M_use_count =
               (local_138.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_138.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi)->_M_use_count =
               (local_138.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      bVar4 = expression_tail(this,&local_138,&local_d8,write_index_00,extent_index,write);
      if (local_138.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_138.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      goto LAB_00128c0a;
    }
    if (this->in_hlp == false) {
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_158,local_158 + local_150)
      ;
      bVar4 = addLocalReference(this,&local_90,write_index,&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if (bVar4) goto LAB_00128883;
      std::__cxx11::string::find((char *)&local_158,0x13e7df,0);
      std::__cxx11::string::substr((ulong)local_70,(ulong)&local_158);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)local_70,0,(char *)0x0,0x13e7d6);
      plVar9 = plVar8 + 2;
      if ((long *)*plVar8 == plVar9) {
        local_e8 = *plVar9;
        lStack_e0 = plVar8[3];
        local_f8 = &local_e8;
      }
      else {
        local_e8 = *plVar9;
        local_f8 = (long *)*plVar8;
      }
      local_f0 = plVar8[1];
      *plVar8 = (long)plVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_f8);
      psVar10 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_178.field_2._M_allocated_capacity = *psVar10;
        local_178.field_2._8_8_ = plVar8[3];
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      }
      else {
        local_178.field_2._M_allocated_capacity = *psVar10;
        local_178._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_178._M_string_length = plVar8[1];
      *plVar8 = (long)psVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      local_118.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_118.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
      if (local_118.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_118.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi)->_M_use_count =
               (local_118.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_118.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi)->_M_use_count =
               (local_118.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      set_error(this,&local_178,&local_118);
      if (local_118.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_118.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p);
      }
      if (local_f8 != &local_e8) {
        operator_delete(local_f8);
      }
      if (local_70[0] ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60) goto LAB_00128c08;
    }
    else {
LAB_00128883:
      if (!write) goto LAB_001289c5;
      if (this->in_hlp != true) goto LAB_00128944;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_158,local_158 + local_150)
      ;
      bVar5 = get_hlp_reference(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (bVar5 != 0xff) {
        r_code::Atom::AssignmentPointer((uchar)&local_178,(ushort)bVar5);
        pAVar7 = r_code::vector<r_code::Atom>::operator[]
                           ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)write_index);
        r_code::Atom::operator=(pAVar7,(Atom *)&local_178);
        goto LAB_00128973;
      }
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_178," error: undeclared variable","");
      local_128.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_128.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
      if (local_128.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_128.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi)->_M_use_count =
               (local_128.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_128.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi)->_M_use_count =
               (local_128.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      set_error(this,&local_178,&local_128);
      if (local_128.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_128.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_70[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_178._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p == &local_178.field_2) goto LAB_00128c08;
    }
    operator_delete(local_70[0]);
  }
LAB_00128c08:
  bVar4 = false;
LAB_00128c0a:
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::~vector
            (&local_d8.things_to_read);
  if (local_d8.str_opcode._M_dataplus._M_p != (pointer)((long)&local_d8 + 0x18U)) {
    operator_delete(local_d8.str_opcode._M_dataplus._M_p);
  }
  r_code::Atom::~Atom(&local_d8.atom);
  if (local_158 != local_148) {
    operator_delete(local_158);
  }
  return bVar4;
}

Assistant:

bool Compiler::expression(RepliStruct::Ptr node, const ReturnType t, uint16_t write_index, uint16_t &extent_index, bool write)
{
    if (node->type != RepliStruct::Structure) {
        return false;
    }

    bool lbl = false;
    std::string label;

    if (node->label != "") {
        label = node->label.substr(0, node->label.size() - 1);
        lbl = true;
    }

    Class p;

    if (!expression_head(node, p, t)) {
        return false;
    }

    if (lbl && !in_hlp) {
        if (!addLocalReference(label, write_index, p)) {
            set_error("cast to " + label.substr(label.find("#") + 1) + ": unknown class", node);
            return false;
        }
    }

    uint8_t tail_write_index = 0;

    if (write) {
        if (lbl && in_hlp) {
            uint8_t variable_index = get_hlp_reference(label);

            if (variable_index == 0xFF) {
                set_error(" error: undeclared variable", node);
                return false;
            }

            current_object->code[write_index] = Atom::AssignmentPointer(variable_index, extent_index);
        } else {
            current_object->code[write_index] = Atom::IPointer(extent_index);
        }

        current_object->code[extent_index++] = p.atom;
        tail_write_index = extent_index;
        extent_index += p.atom.getAtomCount();
    }

    if (!expression_tail(node, p, tail_write_index, extent_index, write)) {
        return false;
    }

    return true;
}